

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5047c::createDFDUnpackedTest3_FormatSRGB8_Test::TestBody
          (createDFDUnpackedTest3_FormatSRGB8_Test *this)

{
  createDFDTestBaseUncomp<3U,_3U> *pcVar1;
  createDFDTestBase<3U,_3U> *pcVar2;
  int iVar3;
  uint *lhs;
  pointer *__ptr;
  char *pcVar4;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  *(undefined4 *)
   &(this->super_createDFDUnpackedTest3).super_createDFDTestBaseUncomp<3U,_3U>.
    super_createDFDTestBase<3U,_3U>.expected.field_0x8 = 0x20101;
  *(undefined8 *)
   (this->super_createDFDUnpackedTest3).super_createDFDTestBaseUncomp<3U,_3U>.
   super_createDFDTestBase<3U,_3U>.expected.samples = 0x70000;
  pcVar1 = &(this->super_createDFDUnpackedTest3).super_createDFDTestBaseUncomp<3U,_3U>;
  (pcVar1->super_createDFDTestBase<3U,_3U>).expected.samples[0].lower = 0;
  (pcVar1->super_createDFDTestBase<3U,_3U>).expected.samples[0].upper = 0xff;
  *(undefined8 *)
   ((this->super_createDFDUnpackedTest3).super_createDFDTestBaseUncomp<3U,_3U>.
    super_createDFDTestBase<3U,_3U>.expected.samples + 1) = 0x1070008;
  pcVar2 = &(this->super_createDFDUnpackedTest3).super_createDFDTestBaseUncomp<3U,_3U>.
            super_createDFDTestBase<3U,_3U>;
  (pcVar2->expected).samples[1].lower = 0;
  (pcVar2->expected).samples[1].upper = 0xff;
  *(undefined4 *)
   ((this->super_createDFDUnpackedTest3).super_createDFDTestBaseUncomp<3U,_3U>.
    super_createDFDTestBase<3U,_3U>.expected.samples + 2) = 0x2070010;
  *(undefined4 *)
   &(this->super_createDFDUnpackedTest3).super_createDFDTestBaseUncomp<3U,_3U>.
    super_createDFDTestBase<3U,_3U>.expected.samples[2].field_0x4 = 0;
  (this->super_createDFDUnpackedTest3).super_createDFDTestBaseUncomp<3U,_3U>.
  super_createDFDTestBase<3U,_3U>.expected.samples[2].lower = 0;
  (this->super_createDFDUnpackedTest3).super_createDFDTestBaseUncomp<3U,_3U>.
  super_createDFDTestBase<3U,_3U>.expected.samples[2].upper = 0xff;
  lhs = (uint *)createDFDUnpacked(0,3,1,0,8);
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4c;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_28,"*dfd","sizeof(expected) + 4U",lhs,(unsigned_long *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
               ,0x1bb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  iVar3 = memcmp(&(this->super_createDFDUnpackedTest3).super_createDFDTestBaseUncomp<3U,_3U>.
                  super_createDFDTestBase<3U,_3U>.expected,lhs + 1,0x48);
  local_38._M_head_impl._0_4_ = iVar3;
  local_30.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"memcmp(&expected, dfd+1, sizeof(expected))","0",(int *)&local_38,
             (int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
               ,0x1bc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  free(lhs);
  return;
}

Assistant:

TEST_F(createDFDUnpackedTest3, FormatSRGB8) {
    customize(KHR_DF_MODEL_RGBSDA, KHR_DF_PRIMARIES_BT709,
              KHR_DF_TRANSFER_SRGB, KHR_DF_FLAG_ALPHA_STRAIGHT,
              {
                {0, 7, KHR_DF_CHANNEL_RGBSDA_RED, 0, 0, 0, 0, 0, 255},
                {8, 7, KHR_DF_CHANNEL_RGBSDA_GREEN, 0, 0, 0, 0, 0, 255},
                {16, 7, KHR_DF_CHANNEL_RGBSDA_BLUE, 0, 0, 0, 0, 0, 255},
              }
             );

    uint32_t* dfd = createDFDUnpacked(KTX_FALSE, 3, 1, KTX_FALSE, s_SRGB);

    EXPECT_EQ(*dfd, sizeof(expected) + 4U);
    EXPECT_EQ(memcmp(&expected, dfd+1, sizeof(expected)), 0);

    free(dfd);
}